

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderLibrary.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)18>_> *
vkt::anon_unknown_0::createPipeline
          (Move<vk::Handle<(vk::HandleType)18>_> *__return_storage_ptr__,Context *context,
          vector<glu::sl::Value,_std::allocator<glu::sl::Value>_> *inputValues,
          ValueBufferLayout *inputLayout,PipelineProgram *program,VkRenderPass renderPass,
          VkPipelineLayout pipelineLayout,UVec2 *renderSize)

{
  pointer *this;
  bool bVar1;
  uint *puVar2;
  size_type sVar3;
  DeviceInterface *vk;
  VkDevice device;
  VkPipelineCache local_328;
  undefined1 local_320 [8];
  VkGraphicsPipelineCreateInfo pipelineParams;
  VkPipelineColorBlendStateCreateInfo blendParams;
  VkPipelineColorBlendAttachmentState attBlendParams;
  undefined1 local_228 [4];
  VkColorComponentFlags allCompMask;
  VkPipelineVertexInputStateCreateInfo vertexInputStateParams;
  VkVertexInputBindingDescription vertexBindings [2];
  undefined1 auStack_1d8 [8];
  VkPipelineInputAssemblyStateCreateInfo inputAssemblyParams;
  VkPipelineRasterizationStateCreateInfo rasterParams;
  VkPipelineMultisampleStateCreateInfo multisampleParams;
  undefined1 local_140 [8];
  VkPipelineViewportStateCreateInfo viewportParams;
  VkRect2D scissor0;
  VkViewport viewport0;
  VkPipelineDepthStencilStateCreateInfo depthStencilParams;
  undefined1 local_70 [8];
  vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
  vertexAttribParams;
  vector<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
  shaderStageParams;
  PipelineProgram *program_local;
  ValueBufferLayout *inputLayout_local;
  vector<glu::sl::Value,_std::allocator<glu::sl::Value>_> *inputValues_local;
  Context *context_local;
  VkPipelineLayout pipelineLayout_local;
  VkRenderPass renderPass_local;
  
  getPipelineShaderStageCreateInfo
            ((vector<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
              *)&vertexAttribParams.
                 super__Vector_base<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,program);
  getVertexAttributeDescriptions
            ((vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
              *)local_70,inputValues,inputLayout);
  viewport0.minDepth = 3.50325e-44;
  viewport0.maxDepth = 0.0;
  scissor0.extent.width = 0;
  scissor0.extent.height = 0;
  puVar2 = tcu::Vector<unsigned_int,_2>::x(renderSize);
  viewport0.x = (float)*puVar2;
  puVar2 = tcu::Vector<unsigned_int,_2>::y(renderSize);
  viewport0.y = (float)*puVar2;
  viewport0.width = 0.0;
  viewport0.height = 1.0;
  viewportParams.pScissors._0_4_ = 0;
  viewportParams.pScissors._4_4_ = 0;
  puVar2 = tcu::Vector<unsigned_int,_2>::x(renderSize);
  scissor0.offset.x = *puVar2;
  puVar2 = tcu::Vector<unsigned_int,_2>::y(renderSize);
  scissor0.offset.y = *puVar2;
  local_140._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
  viewportParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  viewportParams._4_4_ = 0;
  viewportParams.pNext._0_4_ = 0;
  viewportParams.pNext._4_4_ = 1;
  viewportParams._16_8_ = &scissor0.extent;
  viewportParams.pViewports._0_4_ = 1;
  viewportParams._32_8_ = &viewportParams.pScissors;
  rasterParams.lineWidth = 3.36312e-44;
  rasterParams._60_4_ = 0;
  rasterParams.depthBiasEnable = 0;
  rasterParams.depthBiasConstantFactor = 0.0;
  rasterParams.rasterizerDiscardEnable = 0;
  rasterParams.polygonMode = VK_POLYGON_MODE_FILL;
  rasterParams.cullMode = 0;
  rasterParams.frontFace = VK_FRONT_FACE_COUNTER_CLOCKWISE;
  rasterParams.flags = 0;
  rasterParams.depthClampEnable = 0;
  rasterParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  rasterParams._4_4_ = 0;
  inputAssemblyParams.primitiveRestartEnable = 0x17;
  inputAssemblyParams._28_4_ = 0;
  rasterParams.pNext = (void *)0x100000000;
  rasterParams.depthBiasClamp = 1.0;
  rasterParams.depthBiasSlopeFactor = 0.0;
  inputAssemblyParams.pNext = (void *)0x300000000;
  inputAssemblyParams.flags = 0;
  inputAssemblyParams.topology = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
  auStack_1d8 = (undefined1  [8])0x14;
  inputAssemblyParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  inputAssemblyParams._4_4_ = 0;
  vertexInputStateParams.pVertexAttributeDescriptions =
       (VkVertexInputAttributeDescription *)0x800000000;
  local_228 = (undefined1  [4])0x13;
  vertexInputStateParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  vertexInputStateParams._4_4_ = 0;
  vertexInputStateParams.pNext._0_4_ = 0;
  bVar1 = std::vector<glu::sl::Value,_std::allocator<glu::sl::Value>_>::empty(inputValues);
  vertexInputStateParams.pNext._4_4_ = 2 - (uint)bVar1;
  vertexInputStateParams._16_8_ = &vertexInputStateParams.pVertexAttributeDescriptions;
  sVar3 = std::
          vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
          ::size((vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
                  *)local_70);
  vertexInputStateParams.pVertexBindingDescriptions._0_4_ = (undefined4)sVar3;
  vertexInputStateParams._32_8_ =
       std::
       vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
       ::operator[]((vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
                     *)local_70,0);
  blendParams.blendConstants[2] = 0.0;
  blendParams.blendConstants[3] = 1.4013e-45;
  pipelineParams.basePipelineIndex = 0x1a;
  blendParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  blendParams._4_4_ = 0;
  blendParams.pNext._0_4_ = 0;
  blendParams.pNext._4_4_ = 0;
  blendParams.flags = 3;
  blendParams.logicOpEnable = 1;
  blendParams._24_8_ = blendParams.blendConstants + 2;
  blendParams.pAttachments._0_4_ = 0;
  blendParams.pAttachments._4_4_ = 0;
  blendParams.blendConstants[0] = 0.0;
  blendParams.blendConstants[1] = 0.0;
  local_320._0_4_ = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
  pipelineParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineParams._4_4_ = 0;
  pipelineParams.pNext._0_4_ = 0;
  this = &vertexAttribParams.
          super__Vector_base<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
  sVar3 = std::
          vector<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
          ::size((vector<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
                  *)this);
  pipelineParams.pNext._4_4_ = (undefined4)sVar3;
  pipelineParams._16_8_ =
       std::
       vector<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
       ::operator[]((vector<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
                     *)this,0);
  pipelineParams.pStages = (VkPipelineShaderStageCreateInfo *)local_228;
  pipelineParams.pVertexInputState = (VkPipelineVertexInputStateCreateInfo *)auStack_1d8;
  pipelineParams.pInputAssemblyState = (VkPipelineInputAssemblyStateCreateInfo *)0x0;
  pipelineParams.pTessellationState = (VkPipelineTessellationStateCreateInfo *)local_140;
  pipelineParams.pViewportState =
       (VkPipelineViewportStateCreateInfo *)&inputAssemblyParams.primitiveRestartEnable;
  pipelineParams.pRasterizationState =
       (VkPipelineRasterizationStateCreateInfo *)&rasterParams.lineWidth;
  pipelineParams.pMultisampleState = (VkPipelineMultisampleStateCreateInfo *)&viewport0.minDepth;
  pipelineParams.pDepthStencilState =
       (VkPipelineDepthStencilStateCreateInfo *)&pipelineParams.basePipelineIndex;
  pipelineParams.pColorBlendState = (VkPipelineColorBlendStateCreateInfo *)0x0;
  pipelineParams.pDynamicState = (VkPipelineDynamicStateCreateInfo *)pipelineLayout.m_internal;
  pipelineParams.renderPass.m_internal._0_4_ = 0;
  pipelineParams.layout.m_internal = renderPass.m_internal;
  ::vk::Handle<(vk::HandleType)18>::Handle((Handle<(vk::HandleType)18> *)&pipelineParams.subpass,0);
  pipelineParams.basePipelineHandle.m_internal._0_4_ = 0;
  vk = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  ::vk::Handle<(vk::HandleType)15>::Handle(&local_328,0);
  ::vk::createGraphicsPipeline
            (__return_storage_ptr__,vk,device,local_328,(VkGraphicsPipelineCreateInfo *)local_320,
             (VkAllocationCallbacks *)0x0);
  std::
  vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
  ::~vector((vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
             *)local_70);
  std::
  vector<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
  ::~vector((vector<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
             *)&vertexAttribParams.
                super__Vector_base<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

Move<vk::VkPipeline> createPipeline (Context&					context,
									 const vector<Value>&		inputValues,
									 const ValueBufferLayout&	inputLayout,
									 const PipelineProgram&		program,
									 vk::VkRenderPass			renderPass,
									 vk::VkPipelineLayout		pipelineLayout,
									 tcu::UVec2					renderSize)
{
	const vector<vk::VkPipelineShaderStageCreateInfo>	shaderStageParams		(getPipelineShaderStageCreateInfo(program));
	const vector<vk::VkVertexInputAttributeDescription>	vertexAttribParams		(getVertexAttributeDescriptions(inputValues, inputLayout));
	const vk::VkPipelineDepthStencilStateCreateInfo		depthStencilParams		=
	{
		vk::VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO,		// sType
		DE_NULL,															// pNext
		(vk::VkPipelineDepthStencilStateCreateFlags)0,
		VK_FALSE,															// depthTestEnable
		VK_FALSE,															// depthWriteEnable
		vk::VK_COMPARE_OP_ALWAYS,											// depthCompareOp
		VK_FALSE,															// depthBoundsTestEnable
		VK_FALSE,															// stencilTestEnable
		{
			vk::VK_STENCIL_OP_KEEP,												// stencilFailOp;
			vk::VK_STENCIL_OP_KEEP,												// stencilPassOp;
			vk::VK_STENCIL_OP_KEEP,												// stencilDepthFailOp;
			vk::VK_COMPARE_OP_ALWAYS,											// stencilCompareOp;
			0u,																	// stencilCompareMask
			0u,																	// stencilWriteMask
			0u,																	// stencilReference
		},																	// front;
		{
			vk::VK_STENCIL_OP_KEEP,												// stencilFailOp;
			vk::VK_STENCIL_OP_KEEP,												// stencilPassOp;
			vk::VK_STENCIL_OP_KEEP,												// stencilDepthFailOp;
			vk::VK_COMPARE_OP_ALWAYS,											// stencilCompareOp;
			0u,																	// stencilCompareMask
			0u,																	// stencilWriteMask
			0u,																	// stencilReference
		},																	// back;
		-1.0f,																// minDepthBounds
		+1.0f,																// maxDepthBounds
	};
	const vk::VkViewport								viewport0				=
	{
		0.0f,																// originX
		0.0f,																// originY
		(float)renderSize.x(),												// width
		(float)renderSize.y(),												// height
		0.0f,																// minDepth
		1.0f,																// maxDepth
	};
	const vk::VkRect2D									scissor0				=
	{
		{ 0u, 0u },															// offset
		{ renderSize.x(), renderSize.y() }									// extent
	};
	const vk::VkPipelineViewportStateCreateInfo			viewportParams			=
	{
		vk::VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO,			// sType
		DE_NULL,															// pNext
		(vk::VkPipelineViewportStateCreateFlags)0,
		1u,																	// viewportCount
		&viewport0,															// pViewports
		1u,																	// scissorCount
		&scissor0,															// pScissors
	};
	const vk::VkPipelineMultisampleStateCreateInfo		multisampleParams		=
	{
		vk::VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO,		// sType
		DE_NULL,															// pNext
		(vk::VkPipelineMultisampleStateCreateFlags)0,
		vk::VK_SAMPLE_COUNT_1_BIT,											// rasterSamples
		DE_FALSE,															// sampleShadingEnable
		0.0f,																// minSampleShading
		DE_NULL,															// pSampleMask
		VK_FALSE,															// alphaToCoverageEnable
		VK_FALSE,															// alphaToOneEnable
	};
	const vk::VkPipelineRasterizationStateCreateInfo	rasterParams			=
	{
		vk::VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO,		// sType
		DE_NULL,															// pNext
		(vk::VkPipelineRasterizationStateCreateFlags)0,
		DE_TRUE,															// depthClipEnable
		DE_FALSE,															// rasterizerDiscardEnable
		vk::VK_POLYGON_MODE_FILL,											// fillMode
		vk::VK_CULL_MODE_NONE,												// cullMode;
		vk::VK_FRONT_FACE_COUNTER_CLOCKWISE,								// frontFace;
		VK_FALSE,															// depthBiasEnable
		0.0f,																// depthBiasConstantFactor
		0.0f,																// depthBiasClamp
		0.0f,																// depthBiasSlopeFactor
		1.0f,																// lineWidth
	};
	const vk::VkPipelineInputAssemblyStateCreateInfo	inputAssemblyParams		=
	{
		vk::VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO,	// sType
		DE_NULL,															// pNext
		(vk::VkPipelineInputAssemblyStateCreateFlags)0,
		vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,							// topology
		DE_FALSE,															// primitiveRestartEnable
	};
	const vk::VkVertexInputBindingDescription			vertexBindings[]		=
	{
		{
			0u,																	// binding
			(deUint32)sizeof(tcu::Vec2),										// stride
			vk::VK_VERTEX_INPUT_RATE_VERTEX,									// stepRate
		},
		{
			1u,																	// binding
			0u,																	// stride
			vk::VK_VERTEX_INPUT_RATE_INSTANCE,									// stepRate
		},
	};
	const vk::VkPipelineVertexInputStateCreateInfo		vertexInputStateParams	=
	{
		vk::VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO,		// sType
		DE_NULL,															// pNext
		(vk::VkPipelineVertexInputStateCreateFlags)0,
		(inputValues.empty() ? 1u : 2u),									// bindingCount
		vertexBindings,														// pVertexBindingDescriptions
		(deUint32)vertexAttribParams.size(),								// attributeCount
		&vertexAttribParams[0],												// pVertexAttributeDescriptions
	};
	const vk::VkColorComponentFlags						allCompMask				= vk::VK_COLOR_COMPONENT_R_BIT
																				| vk::VK_COLOR_COMPONENT_G_BIT
																				| vk::VK_COLOR_COMPONENT_B_BIT
																				| vk::VK_COLOR_COMPONENT_A_BIT;
	const vk::VkPipelineColorBlendAttachmentState		attBlendParams			=
	{
		VK_FALSE,															// blendEnable
		vk::VK_BLEND_FACTOR_ONE,											// srcBlendColor
		vk::VK_BLEND_FACTOR_ZERO,											// destBlendColor
		vk::VK_BLEND_OP_ADD,												// blendOpColor
		vk::VK_BLEND_FACTOR_ONE,											// srcBlendAlpha
		vk::VK_BLEND_FACTOR_ZERO,											// destBlendAlpha
		vk::VK_BLEND_OP_ADD,												// blendOpAlpha
		allCompMask,														// componentWriteMask
	};
	const vk::VkPipelineColorBlendStateCreateInfo		blendParams				=
	{
		vk::VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO,		// sType
		DE_NULL,															// pNext
		(vk::VkPipelineColorBlendStateCreateFlags)0,
		VK_FALSE,															// logicOpEnable
		vk::VK_LOGIC_OP_COPY,												// logicOp
		1u,																	// attachmentCount
		&attBlendParams,													// pAttachments
		{ 0.0f, 0.0f, 0.0f, 0.0f },											// blendConstants
	};
	const vk::VkGraphicsPipelineCreateInfo				pipelineParams			=
	{
		vk::VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO,				// sType
		DE_NULL,															// pNext
		0u,																	// flags
		(deUint32)shaderStageParams.size(),									// stageCount
		&shaderStageParams[0],												// pStages
		&vertexInputStateParams,											// pVertexInputState
		&inputAssemblyParams,												// pInputAssemblyState
		DE_NULL,															// pTessellationState
		&viewportParams,													// pViewportState
		&rasterParams,														// pRasterState
		&multisampleParams,													// pMultisampleState
		&depthStencilParams,												// pDepthStencilState
		&blendParams,														// pColorBlendState
		(const vk::VkPipelineDynamicStateCreateInfo*)DE_NULL,				// pDynamicState
		pipelineLayout,														// layout
		renderPass,															// renderPass
		0u,																	// subpass
		DE_NULL,															// basePipelineHandle
		0u,																	// basePipelineIndex
	};

	return vk::createGraphicsPipeline(context.getDeviceInterface(), context.getDevice(), DE_NULL, &pipelineParams);
}